

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O2

string * google::protobuf::internal::SubMessagePrefix
                   (string *__return_storage_ptr__,string *prefix,FieldDescriptor *field,int index)

{
  ushort *puVar1;
  AlphaNum local_b0;
  AlphaNum local_80;
  AlphaNum local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)prefix);
  if ((field->field_0x1 & 8) == 0) {
    puVar1 = (ushort *)(field->all_names_).payload_;
    local_b0.piece_._M_len = (size_t)*puVar1;
    local_b0.piece_._M_str = (char *)((long)puVar1 + ~local_b0.piece_._M_len);
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0);
  }
  else {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView("(");
    local_80.piece_._M_str = (field->all_names_).payload_;
    local_80.piece_._M_len = (size_t)*(ushort *)(local_80.piece_._M_str + 2);
    local_80.piece_._M_str = local_80.piece_._M_str + ~local_80.piece_._M_len;
    local_50.piece_ = absl::lts_20250127::NullSafeStringView(")");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0,&local_80,&local_50);
  }
  if (index != -1) {
    local_b0.piece_ = absl::lts_20250127::NullSafeStringView("[");
    absl::lts_20250127::AlphaNum::AlphaNum(&local_80,index);
    local_50.piece_ = absl::lts_20250127::NullSafeStringView("]");
    absl::lts_20250127::StrAppend(__return_storage_ptr__,&local_b0,&local_80,&local_50);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string SubMessagePrefix(const std::string& prefix,
                                    const FieldDescriptor* field, int index) {
  std::string result(prefix);
  if (field->is_extension()) {
    absl::StrAppend(&result, "(", field->full_name(), ")");
  } else {
    absl::StrAppend(&result, field->name());
  }
  if (index != -1) {
    absl::StrAppend(&result, "[", index, "]");
  }
  result.append(".");
  return result;
}